

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O1

string * __thiscall
deqp::sl::ShaderParser::parseShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderParser *this,char *str)

{
  ostringstream *poVar1;
  ostringstream oVar2;
  byte bVar3;
  string *psVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ostringstream *poVar11;
  ostringstream o;
  byte local_349;
  long *local_348;
  int local_340;
  long local_338 [2];
  string *local_328;
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  int iVar10;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  poVar11 = (ostringstream *)(str + 1);
  do {
    poVar1 = poVar11 + 1;
    poVar11 = poVar11 + 1;
  } while (*poVar1 == (ostringstream)0x20);
  for (; (*poVar11 == (ostringstream)0xa || (*poVar11 == (ostringstream)0xd)); poVar11 = poVar11 + 1
      ) {
  }
  while( true ) {
    for (; oVar2 = *poVar11, oVar2 == (ostringstream)0x5c; poVar11 = poVar11 + 2) {
      oVar2 = poVar11[1];
      if (oVar2 != (ostringstream)0x0) {
        if (oVar2 == (ostringstream)0x74) {
          local_320[0] = (ostringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,1);
        }
        else if (oVar2 == (ostringstream)0x6e) {
          local_320[0] = (ostringstream)0xa;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,1);
        }
        else {
          local_320[0] = oVar2;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,1);
        }
      }
    }
    if ((oVar2 == (ostringstream)0x22) && (poVar11[1] == (ostringstream)0x22)) break;
    local_320[0] = oVar2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_320,1);
    poVar11 = poVar11 + 1;
  }
  std::__cxx11::stringbuf::str();
  lVar7 = 0;
  iVar8 = 0;
  while( true ) {
    bVar3 = *(byte *)((long)local_348 + lVar7);
    if (((0x20 < bVar3) || ((0x100002600U >> (bVar3 & 0x3f) & 1) == 0)) || (local_340 <= lVar7))
    break;
    iVar8 = iVar8 + (uint)(bVar3 == 9) * 3 + 1;
    lVar7 = lVar7 + 1;
  }
  local_328 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  if (0 < local_340) {
    bVar5 = true;
    iVar9 = 0;
    iVar6 = 0;
    do {
      bVar3 = *(byte *)((long)local_348 + (long)iVar9);
      iVar10 = iVar9;
      if ((bVar5) && (iVar6 < iVar8)) {
        if (bVar3 < 0xd) {
          if (bVar3 == 9) {
LAB_00db2d56:
            iVar6 = iVar6 + (uint)(bVar3 == 9) * 3 + 1;
            goto LAB_00db2dc2;
          }
          if (bVar3 == 10) goto LAB_00db2d92;
        }
        else {
          if (bVar3 == 0xd) goto LAB_00db2d67;
          if (bVar3 == 0x20) goto LAB_00db2d56;
        }
LAB_00db2dac:
        local_349 = bVar3;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)&local_349,1);
        bVar5 = false;
      }
      else {
        if (bVar3 != 10) {
          if (bVar3 != 0xd) goto LAB_00db2dac;
LAB_00db2d67:
          iVar10 = iVar9 + 1;
          if (*(char *)((long)local_348 + (long)iVar10) == '\n') {
            local_349 = 10;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,(char *)&local_349,1);
            iVar6 = 0;
            bVar5 = true;
            goto LAB_00db2dc2;
          }
        }
LAB_00db2d92:
        local_349 = bVar3;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)&local_349,1);
        iVar6 = 0;
        bVar5 = true;
        iVar10 = iVar9;
      }
LAB_00db2dc2:
      iVar9 = iVar10 + 1;
    } while (iVar9 < local_340);
  }
  psVar4 = local_328;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  if (local_348 != local_338) {
    operator_delete(local_348,local_338[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar4;
}

Assistant:

string ShaderParser::parseShaderSource(const char* str)
{
	const char*   p = str + 2;
	ostringstream o;

	// Eat first empty line from beginning.
	while (*p == ' ')
		p++;
	while (isEOL(*p))
		p++;

	while ((p[0] != '"') || (p[1] != '"'))
	{
		if (*p == '\\')
		{
			switch (p[1])
			{
			case 0:
				DE_ASSERT(DE_FALSE);
				break;
			case 'n':
				o << '\n';
				break;
			case 't':
				o << '\t';
				break;
			default:
				o << p[1];
				break;
			}

			p += 2;
		}
		else
			o << *p++;
	}

	return removeExtraIndentation(o.str());
}